

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfile.cpp
# Opt level: O2

int __thiscall QFile::rename(QFile *this,char *__old,char *__new)

{
  QString *s1;
  long lVar1;
  QFilePrivate *this_00;
  _Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_> _Var2;
  long lVar3;
  bool bVar4;
  char cVar5;
  FileError FVar6;
  int iVar7;
  undefined4 extraout_var;
  EVP_PKEY_CTX *src_00;
  undefined7 uVar8;
  char *__filename;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_270;
  QArrayDataPointer<char16_t> local_258;
  QArrayDataPointer<char16_t> local_240;
  QArrayDataPointer<char16_t> local_228;
  QArrayDataPointer<char16_t> local_210;
  QArrayDataPointer<char16_t> local_1f8;
  QArrayDataPointer<char16_t> local_1e0;
  QArrayDataPointer<char16_t> local_1c8;
  QArrayDataPointer<char16_t> local_1b0;
  QSystemError local_198;
  QSystemError local_190;
  QTemporaryFileName local_188;
  QArrayDataPointer<char> local_158;
  QArrayDataPointer<char> local_138;
  QStringBuilder<QString,_char16_t> local_118;
  QFileSystemEntry local_f0;
  QFileSystemEntry tmp;
  QFileSystemEntry src;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QFilePrivate *)(this->super_QFileDevice).super_QIODevice.super_QObject.d_ptr.d;
  (*(this->super_QFileDevice).super_QIODevice.super_QObject._vptr_QObject[0x1d])(&src,this);
  lVar3 = CONCAT44(src.m_filePath.d.size._4_4_,(undefined4)src.m_filePath.d.size);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&src);
  if (lVar3 == 0) {
    src.m_filePath.d.d._0_4_ = 2;
    src.m_filePath.d.size._4_4_ = 0;
    src.m_filePath.d.d._4_4_ = 0;
    src.m_filePath.d.ptr._0_4_ = 0;
    src.m_filePath.d.ptr._4_4_ = 0;
    src.m_filePath.d.size._0_4_ = 0;
    src.m_nativeFilePath.d.d = (Data *)anon_var_dwarf_1ca02;
    iVar7 = 0;
    QMessageLogger::warning((QMessageLogger *)&src,"QFile::rename: Empty or null file name");
    goto LAB_0021ebbe;
  }
  s1 = &this_00->fileName;
  bVar4 = ::comparesEqual(s1,(QString *)__old);
  if (bVar4) {
    tr(&src.m_filePath,"Destination file is the same file.",(char *)0x0,-1);
    QFileDevicePrivate::setError((QFileDevicePrivate *)this_00,RenameError,&src.m_filePath);
  }
  else {
    bVar4 = exists(this);
    if (bVar4) {
      local_138.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_138.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_138.ptr = &DAT_aaaaaaaaaaaaaaaa;
      QFileSystemEntry::QFileSystemEntry(&src,(QString *)__old);
      QFileSystemEngine::id((QByteArray *)&local_138,&src);
      QFileSystemEntry::~QFileSystemEntry(&src);
      bVar4 = QByteArray::isNull((QByteArray *)&local_138);
      uVar8 = (undefined7)((ulong)this_00 >> 8);
      if (bVar4) {
        QFileDevice::unsetError(&this->super_QFileDevice);
        (*(this->super_QFileDevice).super_QIODevice.super_QObject._vptr_QObject[0xe])(this);
        FVar6 = QFileDevice::error(&this->super_QFileDevice);
        if (FVar6 == NoError) {
          iVar7 = (*(this_00->super_QFileDevicePrivate).super_QIODevicePrivate.super_QObjectPrivate.
                    super_QObjectData._vptr_QObjectData[7])(this_00);
          cVar5 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar7) + 0x60))
                            ((long *)CONCAT44(extraout_var,iVar7),__old);
          if (cVar5 != '\0') {
            QFileDevice::unsetError(&this->super_QFileDevice);
            _Var2.super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl =
                 (this_00->super_QFileDevicePrivate).fileEngine._M_t.
                 super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>
                 .super__Head_base<0UL,_QAbstractFileEngine_*,_false>;
            (**(code **)(*(long *)_Var2.super__Head_base<0UL,_QAbstractFileEngine_*,_false>.
                                  _M_head_impl + 0xf0))
                      (_Var2.super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl,__old)
            ;
            QString::operator=(s1,(QString *)__old);
            iVar7 = (int)CONCAT71(uVar8,1);
            goto LAB_0021ebb1;
          }
          iVar7 = (*(this->super_QFileDevice).super_QIODevice.super_QObject._vptr_QObject[0xc])
                            (this);
          if ((char)iVar7 == '\0') {
            __filename = __old;
            iVar7 = QFilePrivate::copy(this_00,(EVP_PKEY_CTX *)__old,src_00);
            if ((char)iVar7 != '\0') {
              iVar7 = remove(this,__filename);
              if ((char)iVar7 == '\0') {
                tr(&tmp.m_filePath,"Cannot remove source file: %1",(char *)0x0,-1);
                QIODevice::errorString(&local_f0.m_filePath,(QIODevice *)this);
                QString::arg<QString,_true>
                          (&src.m_filePath,&tmp.m_filePath,&local_f0.m_filePath,0,(QChar)0x20);
                QFileDevicePrivate::setError
                          ((QFileDevicePrivate *)this_00,RenameError,&src.m_filePath);
                QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&src)
                ;
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&local_f0);
                QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&tmp)
                ;
                src.m_filePath.d.d._0_4_ = 0xaaaaaaaa;
                src.m_filePath.d.d._4_4_ = 0xaaaaaaaa;
                src.m_filePath.d.ptr._0_4_ = 0xaaaaaaaa;
                src.m_filePath.d.ptr._4_4_ = 0xaaaaaaaa;
                QFile((QFile *)&src,(QString *)__old);
                QFileDevice::setPermissions((QFileDevice *)&src,(Permissions)0x600);
                remove(__old);
                ~QFile((QFile *)&src);
                goto LAB_0021ea4b;
              }
              _Var2.super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl =
                   (this_00->super_QFileDevicePrivate).fileEngine._M_t.
                   super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>
                   .super__Head_base<0UL,_QAbstractFileEngine_*,_false>;
              (**(code **)(*(long *)_Var2.super__Head_base<0UL,_QAbstractFileEngine_*,_false>.
                                    _M_head_impl + 0xf0))
                        (_Var2.super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl,
                         __old);
              QFileDevice::unsetError(&this->super_QFileDevice);
              iVar7 = (int)CONCAT71(uVar8,1);
              setFileName(this,(QString *)__old);
              goto LAB_0021ebb1;
            }
            QIODevice::errorString(&src.m_filePath,(QIODevice *)this);
            QFileDevicePrivate::setError((QFileDevicePrivate *)this_00,RenameError,&src.m_filePath);
          }
          else {
            tr(&src.m_filePath,"Will not rename sequential file using block copy",(char *)0x0,-1);
            QFileDevicePrivate::setError((QFileDevicePrivate *)this_00,RenameError,&src.m_filePath);
          }
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&src);
        }
LAB_0021ea4b:
        iVar7 = 0;
      }
      else {
        local_158.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_158.d._0_4_ = 0xaaaaaaaa;
        local_158.d._4_4_ = 0xaaaaaaaa;
        local_158.ptr._0_4_ = 0xaaaaaaaa;
        local_158.ptr._4_4_ = 0xaaaaaaaa;
        _Var2.super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl =
             (this_00->super_QFileDevicePrivate).fileEngine._M_t.
             super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>.
             _M_t.
             super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>
             .super__Head_base<0UL,_QAbstractFileEngine_*,_false>;
        if (_Var2.super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl ==
            (QAbstractFileEngine *)0x0) {
          QFileSystemEntry::QFileSystemEntry(&src,s1);
          QFileSystemEngine::id((QByteArray *)&local_158,&src);
          QFileSystemEntry::~QFileSystemEntry(&src);
        }
        else {
          (**(code **)(*(long *)_Var2.super__Head_base<0UL,_QAbstractFileEngine_*,_false>.
                                _M_head_impl + 0xc0))(&local_158);
        }
        bVar4 = ::operator==((QByteArray *)&local_158,(QByteArray *)&local_138);
        if (bVar4) {
          iVar7 = QString::compare(s1,(QString *)__old,CaseInsensitive);
          if (iVar7 != 0) goto LAB_0021eb69;
          local_188.length = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          local_188.path.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          local_188.pos = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          local_188.path.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          local_188.path.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
          QTemporaryFileName::QTemporaryFileName(&local_188,s1);
          src._48_8_ = &DAT_aaaaaaaaaaaaaaaa;
          src.m_nativeFilePath.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
          src.m_nativeFilePath.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          src.m_filePath.d.size._0_4_ = 0xaaaaaaaa;
          src.m_filePath.d.size._4_4_ = 0xaaaaaaaa;
          src.m_nativeFilePath.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          src.m_filePath.d.d._0_4_ = 0xaaaaaaaa;
          src.m_filePath.d.d._4_4_ = 0xaaaaaaaa;
          src.m_filePath.d.ptr._0_4_ = 0xaaaaaaaa;
          src.m_filePath.d.ptr._4_4_ = 0xaaaaaaaa;
          QFileSystemEntry::QFileSystemEntry(&src,s1);
          local_190.errorCode = 0;
          local_190.errorScope = NoError;
          iVar7 = 0x10;
          while (bVar4 = iVar7 != 0, iVar7 = iVar7 + -1, bVar4) {
            tmp._48_8_ = &DAT_aaaaaaaaaaaaaaaa;
            tmp.m_nativeFilePath.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
            tmp.m_nativeFilePath.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
            tmp.m_filePath.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
            tmp.m_nativeFilePath.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
            tmp.m_filePath.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
            tmp.m_filePath.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
            QTemporaryFileName::generateNext((NativePath *)&local_f0,&local_188);
            QFileSystemEntry::QFileSystemEntry(&tmp,&local_f0);
            QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_f0);
            bVar4 = QFileSystemEngine::renameFile(&src,&tmp,&local_190);
            if (bVar4) {
              QFileSystemEntry::QFileSystemEntry(&local_f0,(QString *)__old);
              bVar4 = QFileSystemEngine::renameFile(&tmp,&local_f0,&local_190);
              QFileSystemEntry::~QFileSystemEntry(&local_f0);
              if (bVar4) {
                _Var2.super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl =
                     (this_00->super_QFileDevicePrivate).fileEngine._M_t.
                     super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>
                     .super__Head_base<0UL,_QAbstractFileEngine_*,_false>;
                (**(code **)(*(long *)_Var2.super__Head_base<0UL,_QAbstractFileEngine_*,_false>.
                                      _M_head_impl + 0xf0))
                          (_Var2.super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl,
                           __old);
                QString::operator=(s1,(QString *)__old);
                QFileSystemEntry::~QFileSystemEntry(&tmp);
                iVar7 = (int)CONCAT71(uVar8,1);
                goto LAB_0021ef1d;
              }
              local_198.errorCode = 0;
              local_198.errorScope = NoError;
              bVar4 = QFileSystemEngine::renameFile(&tmp,&src,&local_198);
              if (!bVar4) {
                tr((QString *)&local_1e0,"Error while renaming: %1",(char *)0x0,-1);
                QSystemError::toString((QString *)&local_1f8,&local_190);
                QString::arg<QString,_true>
                          ((QString *)&local_1c8,(QString *)&local_1e0,(QString *)&local_1f8,0,
                           (QChar)0x20);
                local_118.a.d.size = local_1c8.size;
                local_118.a.d.ptr = local_1c8.ptr;
                local_118.a.d.d = local_1c8.d;
                local_1c8.d = (Data *)0x0;
                local_1c8.ptr = (char16_t *)0x0;
                local_1c8.size = 0;
                local_118.b = L'\n';
                tr((QString *)&local_228,"Unable to restore from %1: %2",(char *)0x0,-1);
                QFileSystemEntry::filePath((QString *)&local_258,&tmp);
                QDir::toNativeSeparators((QString *)&local_240,(QString *)&local_258);
                QSystemError::toString((QString *)&local_270,&local_198);
                QString::arg<QString,QString>
                          ((type *)&local_210,(QString *)&local_228,(QString *)&local_240,
                           (QString *)&local_270);
                QStringBuilder<QStringBuilder<QString,_char16_t>,_QString>::QStringBuilder
                          ((QStringBuilder<QStringBuilder<QString,_char16_t>,_QString> *)&local_f0,
                           &local_118,(QString *)&local_210);
                QStringBuilder<QStringBuilder<QString,_char16_t>,_QString>::convertTo<QString>
                          ((QString *)&local_1b0,
                           (QStringBuilder<QStringBuilder<QString,_char16_t>,_QString> *)&local_f0);
                QFileDevicePrivate::setError
                          ((QFileDevicePrivate *)this_00,RenameError,(QString *)&local_1b0);
                QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1b0);
                QStringBuilder<QStringBuilder<QString,_char16_t>,_QString>::~QStringBuilder
                          ((QStringBuilder<QStringBuilder<QString,_char16_t>,_QString> *)&local_f0);
                QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_210);
                QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_270);
                QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_240);
                QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_258);
                QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_228);
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&local_118);
                QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1c8);
                QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1f8);
                QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1e0);
                QFileSystemEntry::~QFileSystemEntry(&tmp);
                goto LAB_0021ef1b;
              }
              QFileSystemEntry::~QFileSystemEntry(&tmp);
              break;
            }
            QFileSystemEntry::~QFileSystemEntry(&tmp);
          }
          tr(&local_f0.m_filePath,"Error while renaming: %1",(char *)0x0,-1);
          QSystemError::toString(&local_118.a,&local_190);
          QString::arg<QString,_true>
                    (&tmp.m_filePath,&local_f0.m_filePath,&local_118.a,0,(QChar)0x20);
          QFileDevicePrivate::setError((QFileDevicePrivate *)this_00,RenameError,&tmp.m_filePath);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&tmp);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_118)
          ;
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_f0);
LAB_0021ef1b:
          iVar7 = 0;
LAB_0021ef1d:
          QFileSystemEntry::~QFileSystemEntry(&src);
          QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_188);
        }
        else {
LAB_0021eb69:
          tr(&src.m_filePath,"Destination file exists",(char *)0x0,-1);
          QFileDevicePrivate::setError((QFileDevicePrivate *)this_00,RenameError,&src.m_filePath);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&src);
          iVar7 = 0;
        }
        QArrayDataPointer<char>::~QArrayDataPointer(&local_158);
      }
LAB_0021ebb1:
      QArrayDataPointer<char>::~QArrayDataPointer(&local_138);
      goto LAB_0021ebbe;
    }
    tr(&src.m_filePath,"Source file does not exist.",(char *)0x0,-1);
    QFileDevicePrivate::setError((QFileDevicePrivate *)this_00,RenameError,&src.m_filePath);
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&src);
  iVar7 = 0;
LAB_0021ebbe:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return iVar7;
  }
  __stack_chk_fail();
}

Assistant:

bool
QFile::rename(const QString &newName)
{
    Q_D(QFile);

    // if this is a QTemporaryFile, the virtual fileName() call here may do something
    if (fileName().isEmpty()) {
        qWarning("QFile::rename: Empty or null file name");
        return false;
    }
    if (d->fileName == newName) {
        d->setError(QFile::RenameError, tr("Destination file is the same file."));
        return false;
    }
    if (!exists()) {
        d->setError(QFile::RenameError, tr("Source file does not exist."));
        return false;
    }

    // If the file exists and it is a case-changing rename ("foo" -> "Foo"),
    // compare Ids to make sure it really is a different file.
    // Note: this does not take file engines into account.
    bool changingCase = false;
    QByteArray targetId = QFileSystemEngine::id(QFileSystemEntry(newName));
    if (!targetId.isNull()) {
        QByteArray fileId = d->fileEngine ?
                    d->fileEngine->id() :
                    QFileSystemEngine::id(QFileSystemEntry(d->fileName));
        changingCase = (fileId == targetId && d->fileName.compare(newName, Qt::CaseInsensitive) == 0);
        if (!changingCase) {
            d->setError(QFile::RenameError, tr("Destination file exists"));
            return false;
        }

#if defined(Q_OS_LINUX) && QT_CONFIG(temporaryfile)
        // rename() on Linux simply does nothing when renaming "foo" to "Foo" on a case-insensitive
        // FS, such as FAT32. Move the file away and rename in 2 steps to work around.
        QTemporaryFileName tfn(d->fileName);
        QFileSystemEntry src(d->fileName);
        QSystemError error;
        for (int attempt = 0; attempt < 16; ++attempt) {
            QFileSystemEntry tmp(tfn.generateNext(), QFileSystemEntry::FromNativePath());

            // rename to temporary name
            if (!QFileSystemEngine::renameFile(src, tmp, error))
                continue;

            // rename to final name
            if (QFileSystemEngine::renameFile(tmp, QFileSystemEntry(newName), error)) {
                d->fileEngine->setFileName(newName);
                d->fileName = newName;
                return true;
            }

            // We need to restore the original file.
            QSystemError error2;
            if (QFileSystemEngine::renameFile(tmp, src, error2))
                break;      // report the original error, below

            // report both errors
            d->setError(QFile::RenameError,
                        tr("Error while renaming: %1").arg(error.toString())
                        + u'\n'
                        + tr("Unable to restore from %1: %2").
                        arg(QDir::toNativeSeparators(tmp.filePath()), error2.toString()));
            return false;
        }
        d->setError(QFile::RenameError,
                    tr("Error while renaming: %1").arg(error.toString()));
        return false;
#endif // Q_OS_LINUX
    }
    unsetError();
    close();
    if (error() == QFile::NoError) {
        if (changingCase ? d->engine()->renameOverwrite(newName) : d->engine()->rename(newName)) {
            unsetError();
            // engine was able to handle the new name so we just reset it
            d->fileEngine->setFileName(newName);
            d->fileName = newName;
            return true;
        }

        // Engine was unable to rename and the fallback will delete the original file,
        // so we have to back out here on case-insensitive file systems:
        if (changingCase) {
            d->setError(QFile::RenameError, d->fileEngine->errorString());
            return false;
        }

        if (isSequential()) {
            d->setError(QFile::RenameError, tr("Will not rename sequential file using block copy"));
            return false;
        }

#if QT_CONFIG(temporaryfile)
        // copy the file to the destination first
        if (d->copy(newName)) {
            // succeeded, remove the original
            if (!remove()) {
                d->setError(QFile::RenameError, tr("Cannot remove source file: %1").arg(errorString()));
                QFile out(newName);
                // set it back to writable so we can delete it
                out.setPermissions(ReadUser | WriteUser);
                out.remove(newName);
                return false;
            }
            d->fileEngine->setFileName(newName);
            unsetError();
            setFileName(newName);
            return true;
        } else {
            // change the error type but keep the string
            d->setError(QFile::RenameError, errorString());
        }
#else
        // copy the error from the engine rename() above
        d->setError(QFile::RenameError, d->fileEngine->errorString());
#endif
    }
    return false;
}